

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_test.cpp
# Opt level: O0

bool run_test_type_conversion<unsigned_char*>(Boxed_Value *bv,bool expectedpass)

{
  uchar *puVar1;
  bad_boxed_cast *e;
  exception *e_1;
  uchar *ret;
  bool expectedpass_local;
  Boxed_Value *bv_local;
  
  puVar1 = chaiscript::boxed_cast<unsigned_char*>(bv,(Type_Conversions_State *)0x0);
  use<unsigned_char*>(puVar1);
  return expectedpass;
}

Assistant:

bool run_test_type_conversion(const Boxed_Value &bv, bool expectedpass) {
  try {
    To ret = chaiscript::boxed_cast<To>(bv);
    use(ret);
  } catch (const chaiscript::exception::bad_boxed_cast &e) {
    if (expectedpass) {
      std::cerr << "Failure in run_test_type_conversion: " << e.what() << '\n';
      return false;
    }
    return true;
  } catch (const std::exception &e) {
    std::cerr << "Unexpected standard exception when attempting cast_conversion: " << e.what() << '\n';
    return false;
  } catch (...) {
    std::cerr << "Unexpected unknown exception when attempting cast_conversion.\n";
    return false;
  }

  return expectedpass;
}